

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

IPAsKeyLRU * __thiscall
BinHash<IPAsKeyLRU>::DoInsert
          (BinHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool need_alloc,bool *stored)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  byte local_49;
  IPAsKeyLRU *local_40;
  IPAsKeyLRU *oldKey;
  IPAsKeyLRU *pIStack_30;
  uint32_t hash_index;
  IPAsKeyLRU *retKey;
  bool *stored_local;
  bool need_alloc_local;
  IPAsKeyLRU *key_local;
  BinHash<IPAsKeyLRU> *this_local;
  
  pIStack_30 = (IPAsKeyLRU *)0x0;
  *stored = false;
  if ((key != (IPAsKeyLRU *)0x0) && (this->tableSize != 0)) {
    uVar2 = IPAsKey::Hash(&key->super_IPAsKey);
    uVar4 = uVar2 % this->tableSize;
    local_40 = this->hashBin[uVar4];
    while( true ) {
      local_49 = 0;
      if (local_40 != (IPAsKeyLRU *)0x0) {
        bVar1 = IPAsKey::IsSameKey(&key->super_IPAsKey,&local_40->super_IPAsKey);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      local_40 = local_40->HashNext;
    }
    if (local_40 == (IPAsKeyLRU *)0x0) {
      pIStack_30 = key;
      if (need_alloc) {
        iVar3 = (*(key->super_IPAsKey)._vptr_IPAsKey[2])();
        pIStack_30 = (IPAsKeyLRU *)CONCAT44(extraout_var,iVar3);
      }
      if (pIStack_30 != (IPAsKeyLRU *)0x0) {
        pIStack_30->HashNext = this->hashBin[uVar4];
        this->hashBin[uVar4] = pIStack_30;
        *stored = true;
        this->tableCount = this->tableCount + 1;
      }
    }
    else {
      (*(local_40->super_IPAsKey)._vptr_IPAsKey[3])(local_40,key);
      pIStack_30 = local_40;
      *stored = false;
    }
  }
  return pIStack_30;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }